

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

SPIRType * __thiscall
spirv_cross::CompilerMSL::get_presumed_input_type
          (SPIRType *__return_storage_ptr__,CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  TypedID<(spirv_cross::Types)1> id;
  SPIRType *pSVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  uint32_t local_2c;
  undefined1 local_25;
  uint32_t loc;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *ib_type_local;
  CompilerMSL *this_local;
  SPIRType *type;
  
  local_25 = 0;
  loc = index;
  pSStack_20 = ib_type;
  ib_type_local = (SPIRType *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  pSVar1 = get_physical_member_type(this,ib_type,index);
  SPIRType::SPIRType(__return_storage_ptr__,pSVar1);
  id = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
  local_2c = Compiler::get_member_decoration((Compiler *)this,id.id,loc,DecorationLocation);
  sVar2 = ::std::
          map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
          ::count(&this->inputs_by_location,&local_2c);
  if ((sVar2 != 0) &&
     (pmVar3 = ::std::
               map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
               ::at(&this->inputs_by_location,&local_2c),
     __return_storage_ptr__->vecsize < pmVar3->vecsize)) {
    pmVar3 = ::std::
             map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
             ::at(&this->inputs_by_location,&local_2c);
    __return_storage_ptr__->vecsize = pmVar3->vecsize;
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerMSL::get_presumed_input_type(const SPIRType &ib_type, uint32_t index) const
{
	SPIRType type = get_physical_member_type(ib_type, index);
	uint32_t loc = get_member_decoration(ib_type.self, index, DecorationLocation);
	if (inputs_by_location.count(loc))
	{
		if (inputs_by_location.at(loc).vecsize > type.vecsize)
			type.vecsize = inputs_by_location.at(loc).vecsize;
	}
	return type;
}